

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SSLTest_ECHBuiltinVerifier_Test::TestBody
          (SSLTest_ECHBuiltinVerifier_Test *this)

{
  UniquePtr<X509_STORE> UVar1;
  bool bVar2;
  int iVar3;
  SSL_METHOD *method;
  SSL_METHOD *meth;
  X509_VERIFY_PARAM *pXVar4;
  anon_unknown_0 *paVar5;
  long lVar6;
  long lVar7;
  char *message;
  char *in_R9;
  ScopedTrace gtest_trace_2436;
  bool accept_ech;
  bool use_leaf_secret;
  ScopedTrace gtest_trace_2434;
  AssertionResult gtest_ar_;
  UniquePtr<SSL> client;
  UniquePtr<SSL> server;
  AssertHelper local_b8;
  AssertionResult gtest_ar;
  AssertHelper local_90;
  UniquePtr<SSL_CTX> client_ctx;
  UniquePtr<X509_STORE> store;
  UniquePtr<SSL_CTX> server_ctx;
  UniquePtr<SSL_ECH_KEYS> keys;
  UniquePtr<SSL_ECH_KEYS> wrong_keys;
  UniquePtr<X509> leaf_secret;
  UniquePtr<X509> leaf_public;
  UniquePtr<EVP_PKEY> leaf_key;
  undefined2 local_44;
  undefined2 local_42;
  UniquePtr<X509> root;
  
  CertFromPEM((anon_unknown_0 *)&root,
              "\n-----BEGIN CERTIFICATE-----\nMIIBRzCB7aADAgECAgEBMAoGCCqGSM49BAMCMBIxEDAOBgNVBAMTB1Rlc3QgQ0Ew\nIBcNMDAwMTAxMDAwMDAwWhgPMjA5OTAxMDEwMDAwMDBaMBIxEDAOBgNVBAMTB1Rl\nc3QgQ0EwWTATBgcqhkjOPQIBBggqhkjOPQMBBwNCAAT5JUjrI1DAxSpEl88UkmJw\ntAJqxo/YrSFo9V3MkcNkfTixi5p6MUtO8DazhEgekBcd2+tBAWtl7dy0qpvTqx92\nozIwMDAPBgNVHRMBAf8EBTADAQH/MB0GA1UdDgQWBBTw6ftkexAI6o4r5FntJIfL\nGU5F4zAKBggqhkjOPQQDAgNJADBGAiEAiiNowddQeHZaZFIygwe6RW5/WG4sUXWC\ndkyl9CQzRaYCIQCFS1EvwZbZtMny27fYm1eeYciY0TkJTEi34H1KwyzzIA==\n-----END CERTIFICATE-----\n"
             );
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
       root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
      root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&leaf_key);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x31c514,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&leaf_public,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x940,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&leaf_public,(Message *)&leaf_key);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&leaf_public);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)
        leaf_key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)leaf_key._M_t.
                            super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    goto LAB_001614a9;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  KeyFromPEM((anon_unknown_0 *)&leaf_key,
             "\n-----BEGIN PRIVATE KEY-----\nMIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgj5WKHwHnziiyPauf\n7QukxTwtTyGZkk8qNdms4puJfxqhRANCAARNrkhxabALDlJrHtvkuDwvCWUF/oVC\nhr6PDITHi1lDlJzvVT4aXBH87sH2n2UV5zpx13NHkq1bIC8eRT8eOIe0\n-----END PRIVATE KEY-----\n"
            );
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)
       leaf_key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)
      leaf_key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&leaf_public);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"leaf_key","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&leaf_secret,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x948,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&leaf_secret,(Message *)&leaf_public)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&leaf_secret);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
        leaf_public._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)leaf_public._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                            ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    CertFromPEM((anon_unknown_0 *)&leaf_public,
                "\n-----BEGIN CERTIFICATE-----\nMIIBaDCCAQ6gAwIBAgIBAjAKBggqhkjOPQQDAjASMRAwDgYDVQQDEwdUZXN0IENB\nMCAXDTAwMDEwMTAwMDAwMFoYDzIwOTkwMTAxMDAwMDAwWjAZMRcwFQYDVQQDEw5w\ndWJsaWMuZXhhbXBsZTBZMBMGByqGSM49AgEGCCqGSM49AwEHA0IABE2uSHFpsAsO\nUmse2+S4PC8JZQX+hUKGvo8MhMeLWUOUnO9VPhpcEfzuwfafZRXnOnHXc0eSrVsg\nLx5FPx44h7SjTDBKMAwGA1UdEwEB/wQCMAAwHwYDVR0jBBgwFoAU8On7ZHsQCOqO\nK+RZ7SSHyxlOReMwGQYDVR0RBBIwEIIOcHVibGljLmV4YW1wbGUwCgYIKoZIzj0E\nAwIDSAAwRQIhANqZRhDR/+QL05hsWXMYEwaiHifd9iakKoFEhKFchcF3AiBRAeXw\nwRGGT6+iPmTYM6N5/IDyAb5B9Ke38O6lLEsUwA==\n-----END CERTIFICATE-----\n"
               );
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
         leaf_public._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
    if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
        leaf_public._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message((Message *)&leaf_secret);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"leaf_public","false"
                 ,"true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&keys,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x955,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&keys,(Message *)&leaf_secret);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&keys);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
          leaf_secret._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
        (**(code **)(*(long *)leaf_secret._M_t.
                              super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      CertFromPEM((anon_unknown_0 *)&leaf_secret,
                  "\n-----BEGIN CERTIFICATE-----\nMIIBaTCCAQ6gAwIBAgIBAzAKBggqhkjOPQQDAjASMRAwDgYDVQQDEwdUZXN0IENB\nMCAXDTAwMDEwMTAwMDAwMFoYDzIwOTkwMTAxMDAwMDAwWjAZMRcwFQYDVQQDEw5z\nZWNyZXQuZXhhbXBsZTBZMBMGByqGSM49AgEGCCqGSM49AwEHA0IABE2uSHFpsAsO\nUmse2+S4PC8JZQX+hUKGvo8MhMeLWUOUnO9VPhpcEfzuwfafZRXnOnHXc0eSrVsg\nLx5FPx44h7SjTDBKMAwGA1UdEwEB/wQCMAAwHwYDVR0jBBgwFoAU8On7ZHsQCOqO\nK+RZ7SSHyxlOReMwGQYDVR0RBBIwEIIOc2VjcmV0LmV4YW1wbGUwCgYIKoZIzj0E\nAwIDSQAwRgIhAPQdIz1xCFkc9WuSkxOxJDpywZiEp9SnKcxJ9nwrlRp3AiEA+O3+\nXRqE7XFhHL+7TNC2a9OOAjQsEF137YPWo+rhgko=\n-----END CERTIFICATE-----\n"
                 );
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ =
           (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
           leaf_secret._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
           (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
      if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
          leaf_secret._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
        testing::Message::Message((Message *)&keys);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"leaf_secret",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&wrong_keys,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x962,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&wrong_keys,(Message *)&keys);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&wrong_keys);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if ((__uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>)
            keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>)0x0) {
          (**(code **)(*(long *)keys._M_t.
                                super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t
                                .super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl + 8))()
          ;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        MakeTestECHKeys((anon_unknown_0 *)&keys,'\x01');
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ =
             (__uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>)
             keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl !=
             (__uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>)0x0;
        if ((__uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>)
            keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>)0x0) {
          testing::Message::Message((Message *)&wrong_keys);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x2f7801,"false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&server_ctx,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x967,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&server_ctx,(Message *)&wrong_keys);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&server_ctx);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if ((__uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>)
              wrong_keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>)0x0) {
            (**(code **)(*(long *)wrong_keys._M_t.
                                  super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl + 8)
            )();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          MakeTestECHKeys((anon_unknown_0 *)&wrong_keys,'\x02');
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ =
               (__uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>)
               wrong_keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl !=
               (__uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>)0x0;
          if ((__uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>)
              wrong_keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl ==
              (__uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>)0x0) {
            testing::Message::Message((Message *)&server_ctx);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"wrong_keys",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&client_ctx,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x969,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&client_ctx,(Message *)&server_ctx);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&client_ctx);
            std::__cxx11::string::~string((string *)&gtest_ar);
            if ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)
                server_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0) {
              (**(code **)(*(long *)server_ctx._M_t.
                                    super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl + 8))();
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            method = TLS_method();
            CreateContextWithTestCertificate((anon_unknown_0 *)&server_ctx,method);
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar_.success_ =
                 (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)
                 server_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
                 (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0;
            if ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)
                server_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl ==
                (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0) {
              testing::Message::Message((Message *)&client_ctx);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"server_ctx",
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&store,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x96c,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&store,(Message *)&client_ctx);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&store);
              std::__cxx11::string::~string((string *)&gtest_ar);
              if ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)
                  client_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0) {
                (**(code **)(*(long *)client_ctx._M_t.
                                      super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl + 8))
                          ();
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              meth = (SSL_METHOD *)TLS_method();
              client_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
                   (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)
                   SSL_CTX_new(meth);
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar_.success_ =
                   (tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
                   client_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
                   (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0;
              if ((tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
                  client_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl ==
                  (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0) {
                testing::Message::Message((Message *)&store);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar,(internal *)&gtest_ar_,
                           (AssertionResult *)"client_ctx","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&client,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x96e,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&client,(Message *)&store);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&client);
                std::__cxx11::string::~string((string *)&gtest_ar);
                if ((__uniq_ptr_impl<x509_store_st,_bssl::internal::Deleter>)
                    store._M_t.super___uniq_ptr_impl<x509_store_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_x509_store_st_*,_false>._M_head_impl !=
                    (__uniq_ptr_impl<x509_store_st,_bssl::internal::Deleter>)0x0) {
                  (**(code **)(*(long *)store._M_t.
                                        super___uniq_ptr_impl<x509_store_st,_bssl::internal::Deleter>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_x509_store_st_*,_false>._M_head_impl
                              + 8))();
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
              }
              else {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                store._M_t.super___uniq_ptr_impl<x509_store_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_x509_store_st_*,_false>._M_head_impl =
                     (__uniq_ptr_data<x509_store_st,_bssl::internal::Deleter,_true,_true>)
                     X509_STORE_new();
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar_.success_ =
                     (tuple<x509_store_st_*,_bssl::internal::Deleter>)
                     store._M_t.super___uniq_ptr_impl<x509_store_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_store_st_*,_false>._M_head_impl !=
                     (_Head_base<0UL,_x509_store_st_*,_false>)0x0;
                if ((tuple<x509_store_st_*,_bssl::internal::Deleter>)
                    store._M_t.super___uniq_ptr_impl<x509_store_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_x509_store_st_*,_false>._M_head_impl ==
                    (_Head_base<0UL,_x509_store_st_*,_false>)0x0) {
                  testing::Message::Message((Message *)&client);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"store",
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&server,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x974,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&server,(Message *)&client);
LAB_001611c0:
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&server);
                  std::__cxx11::string::~string((string *)&gtest_ar);
                  if ((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)
                      client._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl !=
                      (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0) {
                    (**(code **)(*(long *)client._M_t.
                                          super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl + 8))
                              ();
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                }
                else {
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  iVar3 = X509_STORE_add_cert((X509_STORE *)
                                              store._M_t.
                                              super___uniq_ptr_impl<x509_store_st,_bssl::internal::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_x509_store_st_*,_false>.
                                              _M_head_impl,
                                              (X509 *)root._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_x509_st_*,_false>.
                                                  _M_head_impl);
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  gtest_ar_.success_ = iVar3 != 0;
                  if (iVar3 == 0) {
                    testing::Message::Message((Message *)&client);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar,(internal *)&gtest_ar_,
                               (AssertionResult *)"X509_STORE_add_cert(store.get(), root.get())",
                               "false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&server,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x975,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&server,(Message *)&client);
                    goto LAB_001611c0;
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  UVar1 = store;
                  store._M_t.super___uniq_ptr_impl<x509_store_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_x509_store_st_*,_false>._M_head_impl =
                       (__uniq_ptr_data<x509_store_st,_bssl::internal::Deleter,_true,_true>)
                       (__uniq_ptr_impl<x509_store_st,_bssl::internal::Deleter>)0x0;
                  SSL_CTX_set_cert_store
                            ((SSL_CTX *)
                             client_ctx._M_t.
                             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                             (X509_STORE *)
                             UVar1._M_t.
                             super___uniq_ptr_impl<x509_store_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_x509_store_st_*,_false>._M_head_impl);
                  SSL_CTX_set_verify((SSL_CTX *)
                                     client_ctx._M_t.
                                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t
                                     .super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,1,
                                     (callback *)0x0);
                  pXVar4 = SSL_CTX_get0_param((SSL_CTX *)
                                              client_ctx._M_t.
                                              super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_ssl_ctx_st_*,_false>.
                                              _M_head_impl);
                  X509_VERIFY_PARAM_set_flags((X509_VERIFY_PARAM *)pXVar4,0x200000);
                  pXVar4 = SSL_CTX_get0_param((SSL_CTX *)
                                              client_ctx._M_t.
                                              super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_ssl_ctx_st_*,_false>.
                                              _M_head_impl);
                  iVar3 = X509_VERIFY_PARAM_set1_host(pXVar4,"secret.example",0xe);
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  gtest_ar_.success_ = iVar3 != 0;
                  if (iVar3 == 0) {
                    testing::Message::Message((Message *)&client);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar,(internal *)&gtest_ar_,
                               (AssertionResult *)
                               "X509_VERIFY_PARAM_set1_host(SSL_CTX_get0_param(client_ctx.get()), kSecretName, strlen(kSecretName))"
                               ,"false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&server,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x97c,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&server,(Message *)&client);
                    goto LAB_001611c0;
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  local_42 = 0x100;
                  lVar6 = 0;
                  while( true ) {
                    if (lVar6 == 2) break;
                    accept_ech = *(bool *)((long)&local_42 + lVar6);
                    testing::ScopedTrace::ScopedTrace<bool>
                              (&gtest_trace_2434,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x982,&accept_ech);
                    local_44 = 0x100;
                    for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
                      use_leaf_secret = *(bool *)((long)&local_44 + lVar7);
                      testing::ScopedTrace::ScopedTrace<bool>
                                (&gtest_trace_2436,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                 ,0x984,&use_leaf_secret);
                      paVar5 = (anon_unknown_0 *)&wrong_keys;
                      if (accept_ech != false) {
                        paVar5 = (anon_unknown_0 *)&keys;
                      }
                      iVar3 = SSL_CTX_set1_ech_keys
                                        ((SSL_CTX *)
                                         server_ctx._M_t.
                                         super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                         *(SSL_ECH_KEYS **)paVar5);
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )0x0;
                      gtest_ar_.success_ = iVar3 != 0;
                      if (iVar3 == 0) {
                        testing::Message::Message((Message *)&client);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                                   (AssertionResult *)
                                   "SSL_CTX_set1_ech_keys( server_ctx.get(), accept_ech ? keys.get() : wrong_keys.get())"
                                   ,"false","true",in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&server,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x988,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&server,(Message *)&client);
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&server);
                        std::__cxx11::string::~string((string *)&gtest_ar);
                        if ((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)
                            client._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl !=
                            (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0) {
                          (**(code **)(*(long *)client._M_t.
                                                super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl
                                      + 8))();
                        }
                        std::
                        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~unique_ptr(&gtest_ar_.message_);
LAB_00161439:
                        testing::ScopedTrace::~ScopedTrace(&gtest_trace_2436);
                        testing::ScopedTrace::~ScopedTrace(&gtest_trace_2434);
                        goto LAB_0016144d;
                      }
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar_.message_);
                      client._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
                           (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
                           (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
                      server._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
                           (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
                           (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
                      bVar2 = CreateClientAndServer
                                        (&client,&server,
                                         (SSL_CTX *)
                                         client_ctx._M_t.
                                         super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                         (SSL_CTX *)
                                         server_ctx._M_t.
                                         super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
                      gtest_ar_.success_ = bVar2;
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )0x0;
                      if (!bVar2) {
                        testing::Message::Message((Message *)&local_b8);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                                   (AssertionResult *)
                                   "CreateClientAndServer(&client, &server, client_ctx.get(), server_ctx.get())"
                                   ,"false","true",in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_90,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x98c,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_b8);
LAB_001613f7:
                        testing::internal::AssertHelper::~AssertHelper(&local_90);
                        std::__cxx11::string::~string((string *)&gtest_ar);
                        if ((long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) !=
                            (long *)0x0) {
                          (**(code **)(*(long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_)
                                      + 8))();
                        }
                        std::
                        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~unique_ptr(&gtest_ar_.message_);
                        std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&server);
                        std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&client);
                        goto LAB_00161439;
                      }
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar_.message_);
                      bVar2 = InstallECHConfigList
                                        ((SSL *)client._M_t.
                                                super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl
                                         ,(SSL_ECH_KEYS *)
                                          keys._M_t.
                                          super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_ssl_ech_keys_st_*,_false>.
                                          _M_head_impl);
                      gtest_ar_.success_ = bVar2;
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )0x0;
                      if (!bVar2) {
                        testing::Message::Message((Message *)&local_b8);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                                   (AssertionResult *)
                                   "InstallECHConfigList(client.get(), keys.get())","false","true",
                                   in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_90,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x98d,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_b8);
                        goto LAB_001613f7;
                      }
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar_.message_);
                      paVar5 = (anon_unknown_0 *)&leaf_public;
                      if (use_leaf_secret != false) {
                        paVar5 = (anon_unknown_0 *)&leaf_secret;
                      }
                      iVar3 = SSL_use_certificate((SSL *)server._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_st_*,_false>.
                                                  _M_head_impl,*(X509 **)paVar5);
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )0x0;
                      gtest_ar_.success_ = iVar3 != 0;
                      if (iVar3 == 0) {
                        testing::Message::Message((Message *)&local_b8);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                                   (AssertionResult *)
                                   "SSL_use_certificate(server.get(), use_leaf_secret ? leaf_secret.get() : leaf_public.get())"
                                   ,"false","true",in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_90,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x992,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_b8);
                        goto LAB_001613f7;
                      }
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar_.message_);
                      iVar3 = SSL_use_PrivateKey((SSL *)server._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_st_*,_false>.
                                                  _M_head_impl,
                                                 (EVP_PKEY *)
                                                 leaf_key._M_t.
                                                 super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>
                                                 .super__Head_base<0UL,_evp_pkey_st_*,_false>.
                                                 _M_head_impl);
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )0x0;
                      gtest_ar_.success_ = iVar3 != 0;
                      if (iVar3 == 0) {
                        testing::Message::Message((Message *)&local_b8);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                                   (AssertionResult *)
                                   "SSL_use_PrivateKey(server.get(), leaf_key.get())","false","true"
                                   ,in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_90,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x993,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_b8);
                        goto LAB_001613f7;
                      }
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar_.message_);
                      CompleteHandshakes((SSL *)client._M_t.
                                                super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl
                                         ,(SSL *)server._M_t.
                                                 super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                                 .super__Head_base<0UL,_ssl_st_*,_false>.
                                                 _M_head_impl);
                      local_b8.data_._0_4_ = 0x3e;
                      if (accept_ech == use_leaf_secret) {
                        local_b8.data_._0_4_ = 0;
                      }
                      gtest_ar_._0_8_ =
                           SSL_get_verify_result
                                     ((SSL *)client._M_t.
                                             super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                             _M_t.
                                             super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
                      testing::internal::CmpHelperEQ<int,long>
                                ((internal *)&gtest_ar,"accept_ech == use_leaf_secret ? 0 : 62",
                                 "SSL_get_verify_result(client.get())",(int *)&local_b8,
                                 (long *)&gtest_ar_);
                      if (gtest_ar.success_ == false) {
                        testing::Message::Message((Message *)&gtest_ar_);
                        message = "";
                        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl !=
                            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )0x0) {
                          message = *(char **)gtest_ar.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_b8,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x99a,message);
                        testing::internal::AssertHelper::operator=(&local_b8,(Message *)&gtest_ar_);
                        testing::internal::AssertHelper::~AssertHelper(&local_b8);
                        if (gtest_ar_._0_8_ != 0) {
                          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                        }
                      }
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar.message_);
                      std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&server);
                      std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&client);
                      testing::ScopedTrace::~ScopedTrace(&gtest_trace_2436);
                    }
                    testing::ScopedTrace::~ScopedTrace(&gtest_trace_2434);
                    lVar6 = lVar6 + 1;
                  }
                }
LAB_0016144d:
                std::unique_ptr<x509_store_st,_bssl::internal::Deleter>::~unique_ptr(&store);
              }
              std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&client_ctx);
            }
            std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&server_ctx);
          }
          std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr(&wrong_keys);
        }
        std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr(&keys);
      }
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&leaf_secret);
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&leaf_public);
  }
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&leaf_key);
LAB_001614a9:
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&root);
  return;
}

Assistant:

TEST(SSLTest, ECHBuiltinVerifier) {
  // These test certificates generated with the following Go program.
  /* clang-format off
func main() {
  notBefore := time.Date(2000, time.January, 1, 0, 0, 0, 0, time.UTC)
  notAfter := time.Date(2099, time.January, 1, 0, 0, 0, 0, time.UTC)
  rootKey, _ := ecdsa.GenerateKey(elliptic.P256(), rand.Reader)
  rootTemplate := &x509.Certificate{
    SerialNumber:          big.NewInt(1),
    Subject:               pkix.Name{CommonName: "Test CA"},
    NotBefore:             notBefore,
    NotAfter:              notAfter,
    BasicConstraintsValid: true,
    IsCA:                  true,
  }
  rootDER, _ := x509.CreateCertificate(rand.Reader, rootTemplate, rootTemplate, &rootKey.PublicKey, rootKey)
  root, _ := x509.ParseCertificate(rootDER)
  pem.Encode(os.Stdout, &pem.Block{Type: "CERTIFICATE", Bytes: rootDER})
  leafKey, _ := ecdsa.GenerateKey(elliptic.P256(), rand.Reader)
  leafKeyDER, _ := x509.MarshalPKCS8PrivateKey(leafKey)
  pem.Encode(os.Stdout, &pem.Block{Type: "PRIVATE KEY", Bytes: leafKeyDER})
  for i, name := range []string{"public.example", "secret.example"} {
    leafTemplate := &x509.Certificate{
      SerialNumber:          big.NewInt(int64(i) + 2),
      Subject:               pkix.Name{CommonName: name},
      NotBefore:             notBefore,
      NotAfter:              notAfter,
      BasicConstraintsValid: true,
      DNSNames:              []string{name},
    }
    leafDER, _ := x509.CreateCertificate(rand.Reader, leafTemplate, root, &leafKey.PublicKey, rootKey)
    pem.Encode(os.Stdout, &pem.Block{Type: "CERTIFICATE", Bytes: leafDER})
  }
}
clang-format on */
  bssl::UniquePtr<X509> root = CertFromPEM(R"(
-----BEGIN CERTIFICATE-----
MIIBRzCB7aADAgECAgEBMAoGCCqGSM49BAMCMBIxEDAOBgNVBAMTB1Rlc3QgQ0Ew
IBcNMDAwMTAxMDAwMDAwWhgPMjA5OTAxMDEwMDAwMDBaMBIxEDAOBgNVBAMTB1Rl
c3QgQ0EwWTATBgcqhkjOPQIBBggqhkjOPQMBBwNCAAT5JUjrI1DAxSpEl88UkmJw
tAJqxo/YrSFo9V3MkcNkfTixi5p6MUtO8DazhEgekBcd2+tBAWtl7dy0qpvTqx92
ozIwMDAPBgNVHRMBAf8EBTADAQH/MB0GA1UdDgQWBBTw6ftkexAI6o4r5FntJIfL
GU5F4zAKBggqhkjOPQQDAgNJADBGAiEAiiNowddQeHZaZFIygwe6RW5/WG4sUXWC
dkyl9CQzRaYCIQCFS1EvwZbZtMny27fYm1eeYciY0TkJTEi34H1KwyzzIA==
-----END CERTIFICATE-----
)");
  ASSERT_TRUE(root);
  bssl::UniquePtr<EVP_PKEY> leaf_key = KeyFromPEM(R"(
-----BEGIN PRIVATE KEY-----
MIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgj5WKHwHnziiyPauf
7QukxTwtTyGZkk8qNdms4puJfxqhRANCAARNrkhxabALDlJrHtvkuDwvCWUF/oVC
hr6PDITHi1lDlJzvVT4aXBH87sH2n2UV5zpx13NHkq1bIC8eRT8eOIe0
-----END PRIVATE KEY-----
)");
  ASSERT_TRUE(leaf_key);
  bssl::UniquePtr<X509> leaf_public = CertFromPEM(R"(
-----BEGIN CERTIFICATE-----
MIIBaDCCAQ6gAwIBAgIBAjAKBggqhkjOPQQDAjASMRAwDgYDVQQDEwdUZXN0IENB
MCAXDTAwMDEwMTAwMDAwMFoYDzIwOTkwMTAxMDAwMDAwWjAZMRcwFQYDVQQDEw5w
dWJsaWMuZXhhbXBsZTBZMBMGByqGSM49AgEGCCqGSM49AwEHA0IABE2uSHFpsAsO
Umse2+S4PC8JZQX+hUKGvo8MhMeLWUOUnO9VPhpcEfzuwfafZRXnOnHXc0eSrVsg
Lx5FPx44h7SjTDBKMAwGA1UdEwEB/wQCMAAwHwYDVR0jBBgwFoAU8On7ZHsQCOqO
K+RZ7SSHyxlOReMwGQYDVR0RBBIwEIIOcHVibGljLmV4YW1wbGUwCgYIKoZIzj0E
AwIDSAAwRQIhANqZRhDR/+QL05hsWXMYEwaiHifd9iakKoFEhKFchcF3AiBRAeXw
wRGGT6+iPmTYM6N5/IDyAb5B9Ke38O6lLEsUwA==
-----END CERTIFICATE-----
)");
  ASSERT_TRUE(leaf_public);
  bssl::UniquePtr<X509> leaf_secret = CertFromPEM(R"(
-----BEGIN CERTIFICATE-----
MIIBaTCCAQ6gAwIBAgIBAzAKBggqhkjOPQQDAjASMRAwDgYDVQQDEwdUZXN0IENB
MCAXDTAwMDEwMTAwMDAwMFoYDzIwOTkwMTAxMDAwMDAwWjAZMRcwFQYDVQQDEw5z
ZWNyZXQuZXhhbXBsZTBZMBMGByqGSM49AgEGCCqGSM49AwEHA0IABE2uSHFpsAsO
Umse2+S4PC8JZQX+hUKGvo8MhMeLWUOUnO9VPhpcEfzuwfafZRXnOnHXc0eSrVsg
Lx5FPx44h7SjTDBKMAwGA1UdEwEB/wQCMAAwHwYDVR0jBBgwFoAU8On7ZHsQCOqO
K+RZ7SSHyxlOReMwGQYDVR0RBBIwEIIOc2VjcmV0LmV4YW1wbGUwCgYIKoZIzj0E
AwIDSQAwRgIhAPQdIz1xCFkc9WuSkxOxJDpywZiEp9SnKcxJ9nwrlRp3AiEA+O3+
XRqE7XFhHL+7TNC2a9OOAjQsEF137YPWo+rhgko=
-----END CERTIFICATE-----
)");
  ASSERT_TRUE(leaf_secret);

  // Use different config IDs so that fuzzer mode, which breaks trial
  // decryption, will observe the key mismatch.
  bssl::UniquePtr<SSL_ECH_KEYS> keys = MakeTestECHKeys(/*config_id=*/1);
  ASSERT_TRUE(keys);
  bssl::UniquePtr<SSL_ECH_KEYS> wrong_keys = MakeTestECHKeys(/*config_id=*/2);
  ASSERT_TRUE(wrong_keys);
  bssl::UniquePtr<SSL_CTX> server_ctx =
      CreateContextWithTestCertificate(TLS_method());
  ASSERT_TRUE(server_ctx);
  bssl::UniquePtr<SSL_CTX> client_ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(client_ctx);

  // Configure the client to verify certificates and expect the secret name.
  // This is the name the client is trying to connect to. If ECH is rejected,
  // BoringSSL will internally override this setting with the public name.
  bssl::UniquePtr<X509_STORE> store(X509_STORE_new());
  ASSERT_TRUE(store);
  ASSERT_TRUE(X509_STORE_add_cert(store.get(), root.get()));
  SSL_CTX_set_cert_store(client_ctx.get(), store.release());
  SSL_CTX_set_verify(client_ctx.get(), SSL_VERIFY_PEER, nullptr);
  X509_VERIFY_PARAM_set_flags(SSL_CTX_get0_param(client_ctx.get()),
                              X509_V_FLAG_NO_CHECK_TIME);
  static const char kSecretName[] = "secret.example";
  ASSERT_TRUE(X509_VERIFY_PARAM_set1_host(SSL_CTX_get0_param(client_ctx.get()),
                                          kSecretName, strlen(kSecretName)));

  // For simplicity, we only run through a pair of representative scenarios here
  // and rely on runner.go to verify that |SSL_get0_ech_name_override| behaves
  // correctly.
  for (bool accept_ech : {false, true}) {
    SCOPED_TRACE(accept_ech);
    for (bool use_leaf_secret : {false, true}) {
      SCOPED_TRACE(use_leaf_secret);

      // The server will reject ECH when configured with the wrong keys.
      ASSERT_TRUE(SSL_CTX_set1_ech_keys(
          server_ctx.get(), accept_ech ? keys.get() : wrong_keys.get()));

      bssl::UniquePtr<SSL> client, server;
      ASSERT_TRUE(CreateClientAndServer(&client, &server, client_ctx.get(),
                                        server_ctx.get()));
      ASSERT_TRUE(InstallECHConfigList(client.get(), keys.get()));

      // Configure the server with the selected certificate.
      ASSERT_TRUE(SSL_use_certificate(server.get(), use_leaf_secret
                                                        ? leaf_secret.get()
                                                        : leaf_public.get()));
      ASSERT_TRUE(SSL_use_PrivateKey(server.get(), leaf_key.get()));

      // The handshake may fail due to name mismatch or ECH reject. We check
      // |SSL_get_verify_result| to confirm the handshake got far enough.
      CompleteHandshakes(client.get(), server.get());
      EXPECT_EQ(accept_ech == use_leaf_secret ? X509_V_OK
                                              : X509_V_ERR_HOSTNAME_MISMATCH,
                SSL_get_verify_result(client.get()));
    }
  }
}